

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstatusnotifieritemadaptor.cpp
# Opt level: O2

void __thiscall
QStatusNotifierItemAdaptor::ProvideXdgActivationToken
          (QStatusNotifierItemAdaptor *this,QString *token)

{
  QLoggingCategory *pQVar1;
  long in_FS_OFFSET;
  QByteArrayView QVar2;
  QArrayDataPointer<char> local_40;
  char *local_28;
  QDebug local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = QtPrivateLogging::qLcTray();
  if (((pQVar1->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
    local_28 = pQVar1->name;
    local_40.d._0_4_ = 2;
    local_40.d._4_4_ = 0;
    local_40.ptr._0_4_ = 0;
    local_40.ptr._4_4_ = 0;
    local_40.size._0_4_ = 0;
    local_40.size._4_4_ = 0;
    QMessageLogger::debug();
    QDebug::operator<<(&local_20,token);
    QDebug::~QDebug(&local_20);
  }
  QString::toUtf8_helper((QString *)&local_40);
  QVar2.m_data._4_4_ = local_40.ptr._4_4_;
  QVar2.m_data._0_4_ = local_40.ptr._0_4_;
  QVar2.m_size._4_4_ = local_40.size._4_4_;
  QVar2.m_size._0_4_ = (undefined4)local_40.size;
  qputenv("XDG_ACTIVATION_TOKEN",QVar2);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStatusNotifierItemAdaptor::ProvideXdgActivationToken(const QString &token)
{
    qCDebug(qLcTray) << token;
    qputenv("XDG_ACTIVATION_TOKEN", token.toUtf8());
}